

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

Error asmjit::v1_14::Formatter::formatLabel
                (String *sb,FormatFlags formatFlags,BaseEmitter *emitter,uint32_t labelId)

{
  CodeHolder *pCVar1;
  LabelEntry *pLVar2;
  LabelEntry *pLVar3;
  Error EVar4;
  LabelEntry **ppLVar5;
  ulong i;
  char *pcVar6;
  
  if ((emitter == (BaseEmitter *)0x0) || (pCVar1 = emitter->_code, pCVar1 == (CodeHolder *)0x0)) {
LAB_001188a0:
    pcVar6 = "L%u";
    goto LAB_001188b0;
  }
  if (labelId < *(uint *)&pCVar1->field_0x100) {
    ppLVar5 = ZoneVector<asmjit::v1_14::LabelEntry_*>::operator[]
                        (&pCVar1->_labelEntries,(ulong)labelId);
    pLVar2 = *ppLVar5;
    if (pLVar2 != (LabelEntry *)0x0) {
      if (*(int *)&pLVar2->_name == 0) goto LAB_001188a0;
      i = (ulong)pLVar2->_parentId;
      if (i == 0xffffffff) goto LAB_00118907;
      if (pLVar2->_parentId < *(uint *)&emitter->_code->field_0x100) {
        ppLVar5 = ZoneVector<asmjit::v1_14::LabelEntry_*>::operator[]
                            (&emitter->_code->_labelEntries,i);
        pLVar3 = *ppLVar5;
        if (pLVar3 == (LabelEntry *)0x0) goto LAB_001188c7;
        if (*(uint *)&pLVar3->_name == 0) {
          pcVar6 = "L%u";
          goto LAB_001188d6;
        }
        if (*(uint *)&pLVar3->_name < 0xc) {
          pcVar6 = &pLVar3->field_0x34;
        }
        else {
          pcVar6 = *(char **)&pLVar3->field_0x38;
        }
        EVar4 = String::_opString(sb,kAppend,pcVar6,0xffffffffffffffff);
      }
      else {
LAB_001188c7:
        pcVar6 = "<InvalidLabel:%u>";
        i = (ulong)labelId;
LAB_001188d6:
        EVar4 = String::_opFormat(sb,kAppend,pcVar6,i);
      }
      if (EVar4 != 0) {
        return EVar4;
      }
      EVar4 = String::_opChar(sb,kAppend,'.');
      if (EVar4 != 0) {
        return EVar4;
      }
LAB_00118907:
      if ((pLVar2->_type == kAnonymous) &&
         (EVar4 = String::_opFormat(sb,kAppend,"L%u@",(ulong)labelId), EVar4 != 0)) {
        return EVar4;
      }
      if (*(uint *)&pLVar2->_name < 0xc) {
        pcVar6 = &pLVar2->field_0x34;
      }
      else {
        pcVar6 = *(char **)&pLVar2->field_0x38;
      }
      EVar4 = String::_opString(sb,kAppend,pcVar6,0xffffffffffffffff);
      return EVar4;
    }
  }
  pcVar6 = "<InvalidLabel:%u>";
LAB_001188b0:
  EVar4 = String::_opFormat(sb,kAppend,pcVar6,(ulong)labelId);
  return EVar4;
}

Assistant:

Error formatLabel(
  String& sb,
  FormatFlags formatFlags,
  const BaseEmitter* emitter,
  uint32_t labelId) noexcept {

  DebugUtils::unused(formatFlags);

  if (emitter && emitter->code()) {
    const LabelEntry* le = emitter->code()->labelEntry(labelId);
    if (ASMJIT_UNLIKELY(!le))
      return sb.appendFormat("<InvalidLabel:%u>", labelId);

    if (le->hasName()) {
      if (le->hasParent()) {
        uint32_t parentId = le->parentId();
        const LabelEntry* pe = emitter->code()->labelEntry(parentId);

        if (ASMJIT_UNLIKELY(!pe))
          ASMJIT_PROPAGATE(sb.appendFormat("<InvalidLabel:%u>", labelId));
        else if (ASMJIT_UNLIKELY(!pe->hasName()))
          ASMJIT_PROPAGATE(sb.appendFormat("L%u", parentId));
        else
          ASMJIT_PROPAGATE(sb.append(pe->name()));

        ASMJIT_PROPAGATE(sb.append('.'));
      }

      if (le->type() == LabelType::kAnonymous)
        ASMJIT_PROPAGATE(sb.appendFormat("L%u@", labelId));
      return sb.append(le->name());
    }
  }

  return sb.appendFormat("L%u", labelId);
}